

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

_Bool cpu_physical_memory_rw_arm(AddressSpace *as,hwaddr addr,void *buf,hwaddr len,_Bool is_write)

{
  MemTxResult MVar1;
  
  MVar1 = address_space_rw_arm(as,addr,(MemTxAttrs)0x1,buf,len,is_write);
  return MVar1 == 0;
}

Assistant:

bool cpu_physical_memory_rw(AddressSpace *as, hwaddr addr, void *buf,
                            hwaddr len, bool is_write)
{
    MemTxResult result = address_space_rw(as, addr, MEMTXATTRS_UNSPECIFIED,
                     buf, len, is_write);
    if (result == MEMTX_OK) {
        return true;
    } else {
        return false;
    }
}